

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

Block * __thiscall
wasm::I64ToI32Lowering::lowerSub
          (I64ToI32Lowering *this,Block *result,TempVar *leftLow,TempVar *leftHigh,TempVar *rightLow
          ,TempVar *rightHigh)

{
  Builder *pBVar1;
  Builder *pBVar2;
  Builder *pBVar3;
  Index IVar4;
  Index IVar5;
  LocalGet *pLVar6;
  LocalGet *pLVar7;
  Binary *pBVar8;
  LocalSet *append;
  LocalSet *args;
  LocalSet *args_1;
  LocalSet *args_2;
  Block *e;
  undefined1 local_c8 [8];
  TempVar lowResult;
  TempVar borrow;
  TempVar highResult;
  
  getTemp((TempVar *)local_c8,this,(Type)0x2);
  getTemp((TempVar *)&borrow.ty,this,(Type)0x2);
  getTemp((TempVar *)&lowResult.ty,this,(Type)0x2);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar4 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_c8);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar5 = TempVar::operator_cast_to_unsigned_int(leftLow);
  pLVar6 = Builder::makeLocalGet(pBVar2,IVar5,(Type)0x2);
  pBVar3 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar5 = TempVar::operator_cast_to_unsigned_int(rightLow);
  pLVar7 = Builder::makeLocalGet(pBVar3,IVar5,(Type)0x2);
  pBVar8 = Builder::makeBinary(pBVar2,SubInt32,(Expression *)pLVar6,(Expression *)pLVar7);
  append = Builder::makeLocalSet(pBVar1,IVar4,(Expression *)pBVar8);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar4 = TempVar::operator_cast_to_unsigned_int((TempVar *)&lowResult.ty);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar5 = TempVar::operator_cast_to_unsigned_int(leftLow);
  pLVar6 = Builder::makeLocalGet(pBVar2,IVar5,(Type)0x2);
  pBVar3 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar5 = TempVar::operator_cast_to_unsigned_int(rightLow);
  pLVar7 = Builder::makeLocalGet(pBVar3,IVar5,(Type)0x2);
  pBVar8 = Builder::makeBinary(pBVar2,LtUInt32,(Expression *)pLVar6,(Expression *)pLVar7);
  args = Builder::makeLocalSet(pBVar1,IVar4,(Expression *)pBVar8);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar4 = TempVar::operator_cast_to_unsigned_int((TempVar *)&borrow.ty);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)&lowResult.ty);
  pLVar6 = Builder::makeLocalGet(pBVar2,IVar5,(Type)0x2);
  pBVar3 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar5 = TempVar::operator_cast_to_unsigned_int(rightHigh);
  pLVar7 = Builder::makeLocalGet(pBVar3,IVar5,(Type)0x2);
  pBVar8 = Builder::makeBinary(pBVar2,AddInt32,(Expression *)pLVar6,(Expression *)pLVar7);
  args_1 = Builder::makeLocalSet(pBVar1,IVar4,(Expression *)pBVar8);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar4 = TempVar::operator_cast_to_unsigned_int((TempVar *)&borrow.ty);
  pBVar2 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar5 = TempVar::operator_cast_to_unsigned_int(leftHigh);
  pLVar6 = Builder::makeLocalGet(pBVar2,IVar5,(Type)0x2);
  pBVar3 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)&borrow.ty);
  pLVar7 = Builder::makeLocalGet(pBVar3,IVar5,(Type)0x2);
  pBVar8 = Builder::makeBinary(pBVar2,SubInt32,(Expression *)pLVar6,(Expression *)pLVar7);
  args_2 = Builder::makeLocalSet(pBVar1,IVar4,(Expression *)pBVar8);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  IVar4 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_c8);
  pLVar6 = Builder::makeLocalGet(pBVar1,IVar4,(Type)0x2);
  e = Builder::blockify<wasm::LocalSet*,wasm::LocalSet*,wasm::LocalSet*,wasm::LocalGet*>
                ((this->builder)._M_t.
                 super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                 super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,(Expression *)result,
                 (Expression *)append,args,args_1,args_2,pLVar6);
  setOutParam(this,(Expression *)e,(TempVar *)&borrow.ty);
  TempVar::~TempVar((TempVar *)&lowResult.ty);
  TempVar::~TempVar((TempVar *)&borrow.ty);
  TempVar::~TempVar((TempVar *)local_c8);
  return e;
}

Assistant:

Block* lowerSub(Block* result,
                  TempVar&& leftLow,
                  TempVar&& leftHigh,
                  TempVar&& rightLow,
                  TempVar&& rightHigh) {
    TempVar lowResult = getTemp();
    TempVar highResult = getTemp();
    TempVar borrow = getTemp();
    LocalSet* subLow = builder->makeLocalSet(
      lowResult,
      builder->makeBinary(SubInt32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32)));
    LocalSet* borrowBit = builder->makeLocalSet(
      borrow,
      builder->makeBinary(LtUInt32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(rightLow, Type::i32)));
    LocalSet* subHigh1 = builder->makeLocalSet(
      highResult,
      builder->makeBinary(AddInt32,
                          builder->makeLocalGet(borrow, Type::i32),
                          builder->makeLocalGet(rightHigh, Type::i32)));
    LocalSet* subHigh2 = builder->makeLocalSet(
      highResult,
      builder->makeBinary(SubInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(highResult, Type::i32)));
    LocalGet* getLow = builder->makeLocalGet(lowResult, Type::i32);
    result =
      builder->blockify(result, subLow, borrowBit, subHigh1, subHigh2, getLow);
    setOutParam(result, std::move(highResult));
    return result;
  }